

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Interval<float> pbrt::Interval<float>::FromValueAndError(float v,float err)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  Interval<float> IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((err == 0.0) && (!NAN(err))) {
    IVar4.high = v;
    IVar4.low = v;
    return IVar4;
  }
  auVar6 = SUB6416(ZEXT464(0xff800000),0);
  fVar1 = v - err;
  if (-INFINITY < fVar1) {
    auVar6._0_12_ = ZEXT812(0);
    auVar6._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar6,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar1 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar1);
    auVar6 = ZEXT416((int)fVar1 + -1 + (uint)(fVar1 <= 0.0) * 2);
  }
  fVar1 = v + err;
  auVar5 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar1 < INFINITY) {
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar5,0);
    fVar1 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar1);
    auVar5 = ZEXT416((-(uint)(fVar1 < 0.0) | 1) + (int)fVar1);
  }
  auVar6 = vinsertps_avx(auVar6,auVar5,0x10);
  return auVar6._0_8_;
}

Assistant:

PBRT_CPU_GPU
    static Interval FromValueAndError(Float v, Float err) {
        Interval i;
        if (err == 0)
            i.low = i.high = v;
        else {
            // Compute conservative bounds by rounding the endpoints away
            // from the middle. Note that this will be over-conservative in
            // cases where v-err or v+err are exactly representable in
            // floating-point, but it's probably not worth the trouble of
            // checking this case.
            i.low = NextFloatDown(v - err);
            i.high = NextFloatUp(v + err);
        }
        return i;
    }